

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

void CompatibilityCVT_Resampler(SDL12_AudioCVT *cvt12,Uint16 format)

{
  Uint8 UVar1;
  undefined2 uVar2;
  int iVar3;
  Uint8 *pUVar4;
  char cVar5;
  long lVar6;
  
  cVar5 = (char)format;
  if (1.0 < cvt12->rate_incr || cvt12->rate_incr == 1.0) {
    if (cVar5 == '\x10') {
      pUVar4 = cvt12->buf;
      iVar3 = cvt12->len_cvt;
      for (lVar6 = 0; iVar3 >> 2 != (int)lVar6; lVar6 = lVar6 + 1) {
        *(undefined2 *)(pUVar4 + lVar6 * 2) = *(undefined2 *)(pUVar4 + lVar6 * 4);
      }
    }
    else if (cVar5 == '\b') {
      pUVar4 = cvt12->buf;
      iVar3 = cvt12->len_cvt;
      for (lVar6 = 0; iVar3 >> 1 != (int)lVar6; lVar6 = lVar6 + 1) {
        pUVar4[lVar6] = pUVar4[lVar6 * 2];
      }
    }
    cvt12->len_cvt = cvt12->len_cvt / 2;
  }
  else {
    if (cVar5 == '\x10') {
      pUVar4 = cvt12->buf;
      iVar3 = cvt12->len_cvt;
      for (lVar6 = 0; -(iVar3 >> 1) != (int)lVar6; lVar6 = lVar6 + -1) {
        uVar2 = *(undefined2 *)(pUVar4 + lVar6 * 2 + (long)iVar3 + -2);
        *(undefined2 *)(pUVar4 + lVar6 * 4 + (long)(iVar3 * 2) + -2) = uVar2;
        *(undefined2 *)(pUVar4 + lVar6 * 4 + (long)(iVar3 * 2) + -4) = uVar2;
      }
    }
    else if (cVar5 == '\b') {
      pUVar4 = cvt12->buf;
      iVar3 = cvt12->len_cvt;
      for (lVar6 = 0; -iVar3 != (int)lVar6; lVar6 = lVar6 + -1) {
        UVar1 = pUVar4[lVar6 + (long)iVar3 + -1];
        pUVar4[lVar6 * 2 + (long)(iVar3 * 2) + -1] = UVar1;
        pUVar4[lVar6 * 2 + (long)(iVar3 * 2) + -2] = UVar1;
      }
    }
    cvt12->len_cvt = cvt12->len_cvt << 1;
  }
  iVar3 = cvt12->filter_index;
  cvt12->filter_index = iVar3 + 1;
  if (cvt12->filters[(long)iVar3 + 1] != (SDL12_AudioCVTFilter)0x0) {
    (*cvt12->filters[(long)iVar3 + 1])(cvt12,format);
    return;
  }
  return;
}

Assistant:

static void SDLCALL
CompatibilityCVT_Resampler(SDL12_AudioCVT *cvt12, Uint16 format)
{
    const int bitsize = (int) SDL_AUDIO_BITSIZE(format);
    int i;

    SDL_assert((bitsize == 8) || (bitsize == 16));  /* there were no 32-bit audio types in 1.2. */

    if (cvt12->rate_incr < 1.0) {   /* upsampling */
        /*printf("2x Upsampling!\n");*/
        #define DO_RESAMPLE(typ) \
            const typ *src = (const typ *) (cvt12->buf + cvt12->len_cvt); \
            typ *dst = (typ *) (cvt12->buf + (cvt12->len_cvt * 2)); \
            for (i = cvt12->len_cvt / sizeof (typ); i; i--) { \
                const typ sample = *(--src); \
                dst -= 2; \
                dst[0] = dst[1] = sample; \
            }
        if (bitsize == 8) {
            DO_RESAMPLE(Uint8);
        } else if (bitsize == 16) {
            DO_RESAMPLE(Uint16);
        }
        #undef DO_RESAMPLE
        cvt12->len_cvt *= 2;
    } else {  /* downsampling. */
        /*printf("2x Downsampling!\n");*/
        #define DO_RESAMPLE(typ) \
            const typ *src = (const typ *) cvt12->buf; \
            typ *dst = (typ *) cvt12->buf; \
            for (i = cvt12->len_cvt / (sizeof (typ) * 2); i; i--, src += 2) { \
                *(dst++) = *src; \
            }
        if (bitsize == 8) {
            DO_RESAMPLE(Uint8);
        } else if (bitsize == 16) {
            DO_RESAMPLE(Uint16);
        }
        #undef DO_RESAMPLE
        cvt12->len_cvt /= 2;
    }

    if (cvt12->filters[++cvt12->filter_index]) {
        cvt12->filters[cvt12->filter_index](cvt12, format);
    }
}